

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sockets.cpp
# Opt level: O0

void __thiscall TcpSocket::TcpSocket(TcpSocket *this,addrinfo *host)

{
  int iVar1;
  string local_1d8 [48];
  stringstream local_1a8 [8];
  stringstream stream;
  ostream local_198 [380];
  undefined4 local_1c;
  addrinfo *paStack_18;
  int enable;
  addrinfo *host_local;
  TcpSocket *this_local;
  
  paStack_18 = host;
  host_local = (addrinfo *)this;
  Socket::Socket(&this->super_Socket,host,1);
  local_1c = 0;
  iVar1 = setsockopt((this->super_Socket).m_Socket,6,1,&local_1c,4);
  if (iVar1 != 0) {
    std::__cxx11::stringstream::stringstream(local_1a8);
    std::operator<<(local_198,"Enabling TCP_NODELAY failed");
    std::__cxx11::stringstream::str();
    Logger::Log(2,local_1d8);
    std::__cxx11::string::~string((string *)local_1d8);
    std::__cxx11::stringstream::~stringstream(local_1a8);
  }
  return;
}

Assistant:

TcpSocket::TcpSocket(const struct addrinfo* const host)
    : Socket(host, SOCK_STREAM)
{
    // AdsDll.lib seems to use TCP_NODELAY, we use it to be compatible
    const int enable = 0;
    if (setsockopt(m_Socket, IPPROTO_TCP, TCP_NODELAY, (const char*)&enable, sizeof(enable))) {
        LOG_WARN("Enabling TCP_NODELAY failed");
    }
}